

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int is_frame_resize_pending(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = (cpi->resize_pending_params).width;
  uVar3 = 0;
  if ((iVar1 != 0) && (iVar2 = (cpi->resize_pending_params).height, iVar2 != 0)) {
    if ((cpi->common).width != iVar1) {
      return 1;
    }
    uVar3 = (uint)((cpi->common).height != iVar2);
  }
  return uVar3;
}

Assistant:

static inline int is_frame_resize_pending(const AV1_COMP *const cpi) {
  const ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  return (resize_pending_params->width && resize_pending_params->height &&
          (cpi->common.width != resize_pending_params->width ||
           cpi->common.height != resize_pending_params->height));
}